

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue json_parse_value(JSParseState *s)

{
  JSValueUnion JVar1;
  JSValue v;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue JVar2;
  int iVar3;
  JSAtom JVar4;
  JSParseState *in_RDI;
  JSValue JVar5;
  uint32_t idx;
  JSValue el;
  JSAtom prop_name;
  JSValue prop_val;
  int ret;
  JSValue val;
  JSContext *ctx;
  undefined4 in_stack_fffffffffffffee8;
  JSAtom in_stack_fffffffffffffeec;
  JSContext *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  JSAtom v_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  JSContext *in_stack_ffffffffffffff10;
  JSValueUnion in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSParseState *in_stack_ffffffffffffff28;
  undefined4 uVar6;
  JSAtom in_stack_ffffffffffffff34;
  undefined4 uVar7;
  JSContext *in_stack_ffffffffffffff38;
  JSValue in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int64_t in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffffa0;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  JSContext *ctx_00;
  uint local_30;
  undefined4 uStack_2c;
  int64_t iVar8;
  undefined4 uStack_c;
  
  ctx_00 = in_RDI->ctx;
  v_00 = (in_RDI->token).val;
  if (v_00 == 0xffffff80) {
    JVar1 = (in_RDI->token).u.str.str.u;
    local_58 = JVar1.int32;
    uStack_54 = JVar1._4_4_;
    iVar8 = (in_RDI->token).u.str.str.tag;
    uStack_50 = (undefined4)iVar8;
    uStack_4c = (undefined4)((ulong)iVar8 >> 0x20);
    iVar3 = json_next_token(in_stack_ffffffffffffff28);
joined_r0x0014781e:
    if (iVar3 == 0) {
LAB_0014798e:
      local_30 = local_58;
      uStack_2c = uStack_54;
      iVar8 = CONCAT44(uStack_4c,uStack_50);
      goto LAB_001479e4;
    }
  }
  else {
    if (v_00 == 0xffffff81) {
      JVar5 = JS_DupValue(ctx_00,(in_RDI->token).u.str.str);
      local_58 = JVar5.u._0_4_;
      uStack_54 = JVar5.u._4_4_;
      uStack_50 = (undefined4)JVar5.tag;
      uStack_4c = JVar5.tag._4_4_;
      iVar3 = json_next_token((JSParseState *)JVar5.tag);
      goto joined_r0x0014781e;
    }
    if (v_00 == 0xffffff83) {
      if (((in_RDI->token).u.ident.atom == 2) || ((in_RDI->token).u.ident.atom == 3)) {
        local_58 = (uint)((in_RDI->token).u.ident.atom == 3);
        uStack_54 = uStack_c;
        uStack_50 = 1;
      }
      else {
        if ((in_RDI->token).u.ident.atom != 1) goto LAB_00147927;
        in_stack_ffffffffffffff00 = 0;
        local_58 = 0;
        uStack_50 = 2;
        uStack_54 = in_stack_ffffffffffffff04;
      }
      uStack_4c = 0;
      iVar3 = json_next_token(in_stack_ffffffffffffff28);
joined_r0x0014791c:
      if (iVar3 != 0) goto LAB_001479b0;
      goto LAB_0014798e;
    }
    if (v_00 == 0x5b) {
      iVar3 = json_next_token(in_stack_ffffffffffffff28);
      if (iVar3 == 0) {
        JVar5 = JS_NewArray(in_stack_fffffffffffffef0);
        local_58 = JVar5.u._0_4_;
        uStack_54 = JVar5.u._4_4_;
        uStack_50 = (undefined4)JVar5.tag;
        uStack_4c = JVar5.tag._4_4_;
        iVar3 = JS_IsException(JVar5);
        if (iVar3 == 0) {
          iVar3 = (in_RDI->token).val;
          while (iVar3 != 0x5d) {
            do {
              JVar5 = json_parse_value((JSParseState *)ctx_00);
              uVar6 = JVar5.u._0_4_;
              uVar7 = JVar5.u._4_4_;
              iVar3 = JS_IsException(JVar5);
              if (iVar3 != 0) goto LAB_001479b0;
              in_stack_fffffffffffffee8 = 7;
              this_obj.tag._0_4_ = uVar6;
              this_obj.u.ptr = in_stack_ffffffffffffff28;
              this_obj.tag._4_4_ = uVar7;
              val_00.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
              val_00.u.float64 = in_stack_ffffffffffffff18.float64;
              iVar3 = JS_DefinePropertyValueUint32
                                (in_stack_ffffffffffffff10,this_obj,
                                 (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),val_00,
                                 in_stack_ffffffffffffffa0);
              if (iVar3 < 0) goto LAB_001479b0;
              if ((in_RDI->token).val != 0x2c) goto LAB_00147770;
              iVar3 = json_next_token(in_stack_ffffffffffffff28);
              if (iVar3 != 0) goto LAB_001479b0;
            } while (in_RDI->ext_json == 0);
            iVar3 = (in_RDI->token).val;
          }
LAB_00147770:
          iVar3 = json_parse_expect((JSParseState *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0)
          ;
          goto joined_r0x0014791c;
        }
      }
    }
    else if (v_00 == 0x7b) {
      iVar3 = json_next_token(in_stack_ffffffffffffff28);
      if (iVar3 == 0) {
        JVar5 = JS_NewObject((JSContext *)0x14739b);
        local_58 = JVar5.u._0_4_;
        uStack_54 = JVar5.u._4_4_;
        uStack_50 = (undefined4)JVar5.tag;
        uStack_4c = JVar5.tag._4_4_;
        iVar3 = JS_IsException(JVar5);
        if (iVar3 == 0) {
          iVar3 = (in_RDI->token).val;
          while (iVar3 != 0x7d) {
            do {
              if ((in_RDI->token).val == -0x7f) {
                JVar5.tag = (int64_t)in_stack_ffffffffffffff28;
                JVar5.u.float64 = in_stack_ffffffffffffff20.float64;
                JVar4 = JS_ValueToAtom((JSContext *)in_stack_ffffffffffffff18.ptr,JVar5);
                if (JVar4 == 0) goto LAB_001479b0;
              }
              else {
                if ((in_RDI->ext_json == 0) || ((in_RDI->token).val != -0x7d)) {
                  js_parse_error(in_RDI,"expecting property name");
                  goto LAB_001479b0;
                }
                JS_DupAtom((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),v_00);
              }
              iVar3 = json_next_token(in_stack_ffffffffffffff28);
              if ((iVar3 != 0) ||
                 (iVar3 = json_parse_expect((JSParseState *)
                                            CONCAT44(in_stack_fffffffffffffeec,
                                                     in_stack_fffffffffffffee8),0), iVar3 != 0)) {
LAB_00147521:
                JS_FreeAtom(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
                goto LAB_001479b0;
              }
              JVar5 = json_parse_value((JSParseState *)ctx_00);
              iVar3 = JS_IsException(JVar5);
              if (iVar3 != 0) goto LAB_00147521;
              in_stack_fffffffffffffee8 = 7;
              this_obj_00.u._4_4_ = in_stack_ffffffffffffff54;
              this_obj_00.u.int32 = in_stack_ffffffffffffff50;
              this_obj_00.tag = in_stack_ffffffffffffff58;
              iVar3 = JS_DefinePropertyValue
                                (in_stack_ffffffffffffff38,this_obj_00,in_stack_ffffffffffffff34,
                                 in_stack_ffffffffffffff40,(int)JVar5.tag);
              JS_FreeAtom(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
              if (iVar3 < 0) goto LAB_001479b0;
              if ((in_RDI->token).val != 0x2c) goto LAB_001475eb;
              iVar3 = json_next_token(in_stack_ffffffffffffff28);
              if (iVar3 != 0) goto LAB_001479b0;
            } while (in_RDI->ext_json == 0);
            iVar3 = (in_RDI->token).val;
          }
LAB_001475eb:
          iVar3 = json_parse_expect((JSParseState *)
                                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0)
          ;
          goto joined_r0x0014781e;
        }
      }
    }
    else {
LAB_00147927:
      if ((in_RDI->token).val == -0x56) {
        js_parse_error(in_RDI,"unexpected end of input");
      }
      else {
        js_parse_error(in_RDI,"unexpected token: \'%.*s\'",
                       (ulong)(uint)((int)in_RDI->buf_ptr - (int)(in_RDI->token).ptr),
                       (in_RDI->token).ptr);
      }
    }
  }
LAB_001479b0:
  v.u._4_4_ = v_00;
  v.u.int32 = in_stack_fffffffffffffef8;
  v.tag._0_4_ = in_stack_ffffffffffffff00;
  v.tag._4_4_ = in_stack_ffffffffffffff04;
  JS_FreeValue(in_stack_fffffffffffffef0,v);
  local_30 = 0;
  iVar8 = 6;
LAB_001479e4:
  JVar2.u._4_4_ = uStack_2c;
  JVar2.u.int32 = local_30;
  JVar2.tag = iVar8;
  return JVar2;
}

Assistant:

static JSValue json_parse_value(JSParseState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val = JS_NULL;
    int ret;

    switch(s->token.val) {
    case '{':
        {
            JSValue prop_val;
            JSAtom prop_name;
            
            if (json_next_token(s))
                goto fail;
            val = JS_NewObject(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != '}') {
                for(;;) {
                    if (s->token.val == TOK_STRING) {
                        prop_name = JS_ValueToAtom(ctx, s->token.u.str.str);
                        if (prop_name == JS_ATOM_NULL)
                            goto fail;
                    } else if (s->ext_json && s->token.val == TOK_IDENT) {
                        prop_name = JS_DupAtom(ctx, s->token.u.ident.atom);
                    } else {
                        js_parse_error(s, "expecting property name");
                        goto fail;
                    }
                    if (json_next_token(s))
                        goto fail1;
                    if (json_parse_expect(s, ':'))
                        goto fail1;
                    prop_val = json_parse_value(s);
                    if (JS_IsException(prop_val)) {
                    fail1:
                        JS_FreeAtom(ctx, prop_name);
                        goto fail;
                    }
                    ret = JS_DefinePropertyValue(ctx, val, prop_name,
                                                 prop_val, JS_PROP_C_W_E);
                    JS_FreeAtom(ctx, prop_name);
                    if (ret < 0)
                        goto fail;

                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    if (s->ext_json && s->token.val == '}')
                        break;
                }
            }
            if (json_parse_expect(s, '}'))
                goto fail;
        }
        break;
    case '[':
        {
            JSValue el;
            uint32_t idx;

            if (json_next_token(s))
                goto fail;
            val = JS_NewArray(ctx);
            if (JS_IsException(val))
                goto fail;
            if (s->token.val != ']') {
                idx = 0;
                for(;;) {
                    el = json_parse_value(s);
                    if (JS_IsException(el))
                        goto fail;
                    ret = JS_DefinePropertyValueUint32(ctx, val, idx, el, JS_PROP_C_W_E);
                    if (ret < 0)
                        goto fail;
                    if (s->token.val != ',')
                        break;
                    if (json_next_token(s))
                        goto fail;
                    idx++;
                    if (s->ext_json && s->token.val == ']')
                        break;
                }
            }
            if (json_parse_expect(s, ']'))
                goto fail;
        }
        break;
    case TOK_STRING:
        val = JS_DupValue(ctx, s->token.u.str.str);
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_NUMBER:
        val = s->token.u.num.val;
        if (json_next_token(s))
            goto fail;
        break;
    case TOK_IDENT:
        if (s->token.u.ident.atom == JS_ATOM_false ||
            s->token.u.ident.atom == JS_ATOM_true) {
            val = JS_NewBool(ctx, (s->token.u.ident.atom == JS_ATOM_true));
        } else if (s->token.u.ident.atom == JS_ATOM_null) {
            val = JS_NULL;
        } else {
            goto def_token;
        }
        if (json_next_token(s))
            goto fail;
        break;
    default:
    def_token:
        if (s->token.val == TOK_EOF) {
            js_parse_error(s, "unexpected end of input");
        } else {
            js_parse_error(s, "unexpected token: '%.*s'",
                           (int)(s->buf_ptr - s->token.ptr), s->token.ptr);
        }
        goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}